

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoLocator.cpp
# Opt level: O0

RealType OpenMD::MoLocator::getAtomMass(string *at,ForceField *myFF)

{
  AtomType *pAVar1;
  ostream *poVar2;
  string *in_RDI;
  AtomType *atomType;
  RealType mass;
  AtomType *in_stack_00000038;
  RealType local_18;
  
  pAVar1 = ForceField::getAtomType((ForceField *)at,(string *)myFF);
  if (pAVar1 == (AtomType *)0x0) {
    local_18 = 0.0;
    poVar2 = std::operator<<((ostream *)&std::cerr,"Can not find AtomType: ");
    poVar2 = std::operator<<(poVar2,in_RDI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_18 = AtomType::getMass(in_stack_00000038);
  }
  return local_18;
}

Assistant:

RealType MoLocator::getAtomMass(const std::string& at, ForceField* myFF) {
    RealType mass;
    AtomType* atomType = myFF->getAtomType(at);
    if (atomType != NULL) {
      mass = atomType->getMass();
    } else {
      mass = 0.0;
      std::cerr << "Can not find AtomType: " << at << std::endl;
    }
    return mass;
  }